

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O1

void Eigen::internal::computeProductBlockingSizes<double,double,1,long>(long *k,long *m,long *n)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int l3;
  int l2;
  int l1;
  uint local_3c;
  uint local_38;
  int local_34;
  
  if (manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize == 0) {
    local_34 = -1;
    queryCacheSizes(&local_34,(int *)&local_38,(int *)&local_3c);
    iVar2 = 0x2000;
    if (0 < local_34) {
      iVar2 = local_34;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize = (long)iVar2;
    local_38 = 0xffffffff;
    local_3c = 0xffffffff;
    queryCacheSizes(&local_34,(int *)&local_38,(int *)&local_3c);
    if ((int)local_3c < (int)local_38) {
      local_3c = local_38;
    }
    manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = 0x100000;
    if (0 < (int)local_3c) {
      manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize = (ulong)local_3c;
    }
  }
  uVar1 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l2CacheSize;
  lVar3 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize + 0x7f;
  if (-1 < manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize) {
    lVar3 = manage_caching_sizes(Eigen::Action,long*,long*)::m_l1CacheSize;
  }
  lVar4 = lVar3 >> 7;
  if (*k <= lVar3 >> 7) {
    lVar4 = *k;
  }
  *k = lVar4;
  if (lVar4 < 1) {
    uVar1 = 0;
  }
  else {
    uVar1 = uVar1 / (ulong)(lVar4 << 5);
  }
  if ((long)uVar1 < *m) {
    *m = (ulong)((uint)uVar1 & 0xfffffffc);
  }
  return;
}

Assistant:

void computeProductBlockingSizes(SizeType& k, SizeType& m, SizeType& n)
{
  EIGEN_UNUSED_VARIABLE(n);
  // Explanations:
  // Let's recall the product algorithms form kc x nc horizontal panels B' on the rhs and
  // mc x kc blocks A' on the lhs. A' has to fit into L2 cache. Moreover, B' is processed
  // per kc x nr vertical small panels where nr is the blocking size along the n dimension
  // at the register level. For vectorization purpose, these small vertical panels are unpacked,
  // e.g., each coefficient is replicated to fit a packet. This small vertical panel has to
  // stay in L1 cache.
  std::ptrdiff_t l1, l2;

  typedef gebp_traits<LhsScalar,RhsScalar> Traits;
  enum {
    kdiv = KcFactor * 2 * Traits::nr
         * Traits::RhsProgress * sizeof(RhsScalar),
    mr = gebp_traits<LhsScalar,RhsScalar>::mr,
    mr_mask = (0xffffffff/mr)*mr
  };

  manage_caching_sizes(GetAction, &l1, &l2);
  k = std::min<SizeType>(k, l1/kdiv);
  SizeType _m = k>0 ? l2/(4 * sizeof(LhsScalar) * k) : 0;
  if(_m<m) m = _m & mr_mask;
}